

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Extract.hpp
# Opt level: O2

extraction_result_t * __thiscall
bredis::extractor<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::operator()
          (extraction_result_t *__return_storage_ptr__,
          extractor<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *this,
          int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *value)

{
  type tVar1;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&local_30);
  std::__cxx11::string::
  _M_replace_dispatch<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
            ((string *)&local_30,local_30._M_dataplus._M_p + local_30._M_string_length);
  tVar1 = (type)boost::lexical_cast<long,std::__cxx11::string>(&local_30);
  (__return_storage_ptr__->storage_).super_aligned_storage_imp<32UL,_8UL>.data_.align_ = tVar1;
  __return_storage_ptr__->which_ = 0;
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

extracts::extraction_result_t
    operator()(const markers::int_t<Iterator> &value) const {
        std::string str;
        auto size = std::distance(value.string.from, value.string.to);
        str.reserve(size);
        str.append(value.string.from, value.string.to);
        return extracts::int_t{boost::lexical_cast<extracts::int_t>(str)};
    }